

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int parse_png_file(png *z,int scan,int req_comp)

{
  uint8 **ppuVar1;
  byte bVar2;
  FILE *pFVar3;
  byte bVar4;
  uint uVar5;
  uint32 uVar6;
  uint32 uVar7;
  int iVar8;
  size_t sVar9;
  uint8 *puVar10;
  size_t sVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  uint8 *puVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  byte *pbVar22;
  uint8 *puVar23;
  byte bVar24;
  byte bVar25;
  ulong uVar26;
  uint uVar27;
  uint8 *puVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  uint8 tc [3];
  uint32 raw_len;
  uint8 palette [1024];
  uint8 local_4ab [3];
  int local_4a8;
  uint local_4a4;
  long local_4a0;
  ulong local_498;
  ulong local_490;
  uint local_484;
  long local_480;
  ulong local_478;
  undefined8 local_470;
  size_t local_468;
  uint local_460;
  int local_45c;
  long local_458;
  long local_450;
  long local_448;
  ulong local_440;
  uint8 auStack_438 [1032];
  
  lVar18 = 0;
  local_484 = req_comp;
  do {
    uVar5 = get8(&z->s);
    pbVar22 = &check_png_header_png_sig + lVar18;
    if (uVar5 != *pbVar22) {
      failure_reason = "Not a PNG";
      break;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 8);
  iVar13 = 0;
  if (uVar5 == *pbVar22) {
    iVar13 = 1;
    if (scan != 1) {
      local_490 = 0;
      bVar20 = 1;
      local_468 = 0;
      local_498 = 0;
      local_470 = 0;
      bVar4 = 0;
      iVar13 = 1;
      do {
        uVar6 = get32(&z->s);
        uVar7 = get32(&z->s);
        if ((bool)(uVar7 != 0x49484452 & bVar20)) goto LAB_001c32bd;
        uVar31 = (ulong)uVar6;
        uVar5 = (uint)local_490;
        if ((int)uVar7 < 0x49484452) {
          if (uVar7 == 0x49444154) {
            if ((bVar4 == 0) || (uVar5 != 0)) {
              uVar5 = uVar6 + (int)local_498;
              sVar11 = local_468;
              if ((uint)local_468 < uVar5) {
                sVar9 = 0x1000;
                if (0x1000 < uVar6) {
                  sVar9 = uVar31;
                }
                if ((uint)local_468 != 0) {
                  sVar9 = local_468 & 0xffffffff;
                }
                do {
                  sVar11 = sVar9;
                  sVar9 = (ulong)((uint)sVar11 * 2);
                } while ((uint)sVar11 < uVar5);
                puVar10 = (uint8 *)realloc(z->idata,sVar11);
                if (puVar10 == (uint8 *)0x0) {
                  failure_reason = "Out of memory";
                  iVar13 = 0;
                  bVar32 = false;
                  local_468 = sVar11;
                  goto LAB_001c32d0;
                }
                z->idata = puVar10;
              }
              pFVar3 = (FILE *)(z->s).img_file;
              local_468 = sVar11;
              if (pFVar3 == (FILE *)0x0) {
                memcpy(z->idata + (local_498 & 0xffffffff),(z->s).img_buffer,uVar31);
                ppuVar1 = &(z->s).img_buffer;
                *ppuVar1 = *ppuVar1 + uVar31;
              }
              else {
                sVar11 = fread(z->idata + (local_498 & 0xffffffff),1,uVar31,pFVar3);
                if (sVar11 != uVar31) goto LAB_001c32bd;
              }
              local_498 = (ulong)uVar5;
              goto LAB_001c36ef;
            }
LAB_001c3474:
            failure_reason = "Corrupt PNG";
            local_490 = 0;
          }
          else {
            if (uVar7 == 0x49454e44) {
              iVar13 = 1;
              if (scan == 0) {
                if (z->idata == (uint8 *)0x0) {
                  failure_reason = "Corrupt PNG";
LAB_001c3611:
                  iVar13 = 0;
                }
                else {
                  puVar10 = (uint8 *)stbi_zlib_decode_malloc_guesssize
                                               ((char *)z->idata,(int)local_498,0x4000,&local_45c);
                  uVar5 = local_484;
                  z->expanded = puVar10;
                  iVar13 = 0;
                  if (puVar10 != (uint8 *)0x0) {
                    bVar32 = local_484 == 3;
                    free(z->idata);
                    z->idata = (uint8 *)0x0;
                    uVar21 = (z->s).img_n;
                    uVar31 = (ulong)uVar21;
                    local_460 = uVar21 + 1;
                    if ((char)local_470 == '\0' && ((bVar4 != 0 || bVar32) || local_460 != uVar5)) {
                      (z->s).img_out_n = uVar21;
                    }
                    else {
                      (z->s).img_out_n = local_460;
                    }
                    uVar5 = (z->s).img_out_n;
                    lVar18 = (long)(int)uVar5;
                    if (local_460 != uVar5 && uVar21 != uVar5) {
                      __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                                    ,0x825,"int create_png_image(png *, uint8 *, uint32, int)");
                    }
                    pbVar22 = z->expanded;
                    local_478 = CONCAT44(local_478._4_4_,local_45c);
                    uVar6 = (z->s).img_x;
                    local_4a4 = uVar6 * uVar5;
                    uVar7 = (z->s).img_y;
                    puVar10 = (uint8 *)malloc((ulong)(uVar7 * local_4a4));
                    z->out = puVar10;
                    if (puVar10 == (uint8 *)0x0) {
                      failure_reason = "Out of memory";
                    }
                    else if ((uVar6 * uVar21 + 1) * uVar7 == (int)local_478) {
                      if (uVar7 != 0) {
                        local_458 = (long)(int)uVar21;
                        local_4a0 = lVar18 - local_458;
                        local_448 = local_4a0 - (ulong)local_4a4;
                        local_480 = -(ulong)local_4a4;
                        uVar15 = 0;
                        uVar19 = 0;
                        do {
                          local_478 = uVar19;
                          bVar20 = *pbVar22;
                          local_440 = (ulong)bVar20;
                          pbVar22 = pbVar22 + 1;
                          local_450 = lVar18;
                          if (local_440 < 5) {
                            uVar19 = local_440;
                            if (local_478 == 0) {
                              uVar19 = (ulong)""[local_440];
                            }
                            puVar10 = z->out;
                            if (0 < (int)uVar21) {
                              uVar26 = 0;
                              do {
                                switch(uVar19) {
                                case 0:
                                case 1:
                                case 5:
                                case 6:
                                  bVar24 = pbVar22[uVar26];
                                  goto LAB_001c3849;
                                case 2:
                                case 4:
                                  bVar24 = puVar10[uVar26 + local_480 + uVar15];
                                  break;
                                case 3:
                                  bVar24 = puVar10[uVar26 + local_480 + uVar15] >> 1;
                                  break;
                                default:
                                  goto switchD_001c382e_default;
                                }
                                bVar24 = bVar24 + pbVar22[uVar26];
LAB_001c3849:
                                puVar10[uVar26 + uVar15] = bVar24;
switchD_001c382e_default:
                                uVar26 = uVar26 + 1;
                              } while (uVar31 != uVar26);
                            }
                            uVar27 = local_4a4 * (int)local_478;
                            if (uVar21 != uVar5) {
                              puVar10[local_458 + (ulong)uVar27] = 0xff;
                            }
                            pbVar22 = pbVar22 + local_458;
                            puVar28 = puVar10 + lVar18 + (ulong)uVar27;
                            puVar23 = puVar10 + lVar18 + local_480 + (ulong)uVar27;
                            if (uVar21 == uVar5) {
                              switch(uVar19) {
                              case 0:
                                uVar6 = (z->s).img_x;
                                while (uVar6 = uVar6 - 1, uVar6 != 0) {
                                  if (0 < (int)uVar21) {
                                    uVar19 = 0;
                                    do {
                                      puVar28[uVar19] = pbVar22[uVar19];
                                      uVar19 = uVar19 + 1;
                                    } while (uVar31 != uVar19);
                                  }
                                  pbVar22 = pbVar22 + local_458;
                                  puVar28 = puVar28 + local_458;
                                }
                                break;
                              case 1:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar10 = puVar10 + uVar15 + local_4a0;
                                  do {
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        puVar28[uVar19] = puVar10[uVar19] + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + local_458;
                                    puVar10 = puVar10 + local_458;
                                    iVar13 = iVar13 + -1;
                                  } while (iVar13 != 0);
                                }
                                break;
                              case 2:
                                uVar6 = (z->s).img_x;
                                while (uVar6 = uVar6 - 1, uVar6 != 0) {
                                  if (0 < (int)uVar21) {
                                    uVar19 = 0;
                                    do {
                                      puVar28[uVar19] = puVar23[uVar19] + pbVar22[uVar19];
                                      uVar19 = uVar19 + 1;
                                    } while (uVar31 != uVar19);
                                  }
                                  pbVar22 = pbVar22 + local_458;
                                  puVar28 = puVar28 + local_458;
                                  puVar23 = puVar23 + local_458;
                                }
                                break;
                              case 3:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar10 = puVar10 + uVar15 + local_4a0;
                                  do {
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        puVar28[uVar19] =
                                             (char)((uint)puVar10[uVar19] + (uint)puVar23[uVar19] >>
                                                   1) + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + local_458;
                                    puVar23 = puVar23 + local_458;
                                    puVar10 = puVar10 + local_458;
                                    iVar13 = iVar13 + -1;
                                  } while (iVar13 != 0);
                                }
                                break;
                              case 4:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar16 = puVar10 + uVar15 + local_448;
                                  puVar10 = puVar10 + uVar15 + local_4a0;
                                  do {
                                    local_4a8 = iVar13;
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        bVar24 = puVar10[uVar19];
                                        bVar2 = puVar23[uVar19];
                                        bVar25 = puVar16[uVar19];
                                        iVar13 = ((uint)bVar24 + (uint)bVar2) - (uint)bVar25;
                                        uVar30 = iVar13 - (uint)bVar24;
                                        uVar27 = -uVar30;
                                        if (0 < (int)uVar30) {
                                          uVar27 = uVar30;
                                        }
                                        uVar29 = iVar13 - (uint)bVar2;
                                        uVar30 = -uVar29;
                                        if (0 < (int)uVar29) {
                                          uVar30 = uVar29;
                                        }
                                        uVar12 = iVar13 - (uint)bVar25;
                                        uVar29 = -uVar12;
                                        if (0 < (int)uVar12) {
                                          uVar29 = uVar12;
                                        }
                                        if (uVar30 <= uVar29) {
                                          bVar25 = bVar2;
                                        }
                                        if (uVar29 < uVar27) {
                                          bVar24 = bVar25;
                                        }
                                        if (uVar30 < uVar27) {
                                          bVar24 = bVar25;
                                        }
                                        puVar28[uVar19] = bVar24 + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + local_458;
                                    puVar23 = puVar23 + local_458;
                                    puVar16 = puVar16 + local_458;
                                    puVar10 = puVar10 + local_458;
                                    iVar13 = local_4a8 + -1;
                                  } while (local_4a8 + -1 != 0);
                                }
                                break;
                              case 5:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar10 = puVar10 + uVar15 + local_4a0;
                                  do {
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        puVar28[uVar19] = (puVar10[uVar19] >> 1) + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + local_458;
                                    puVar10 = puVar10 + local_458;
                                    iVar13 = iVar13 + -1;
                                  } while (iVar13 != 0);
                                }
                                break;
                              case 6:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar10 = puVar10 + uVar15 + local_4a0;
                                  do {
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        puVar28[uVar19] = puVar10[uVar19] + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + local_458;
                                    puVar10 = puVar10 + local_458;
                                    iVar13 = iVar13 + -1;
                                  } while (iVar13 != 0);
                                }
                              }
                            }
                            else {
                              if (local_460 != uVar5) {
                                __assert_fail("img_n+1 == out_n",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                                              ,0x851,
                                              "int create_png_image(png *, uint8 *, uint32, int)");
                              }
                              switch(uVar19) {
                              case 0:
                                uVar6 = (z->s).img_x;
                                while (uVar6 = uVar6 - 1, uVar6 != 0) {
                                  if (0 < (int)uVar21) {
                                    uVar19 = 0;
                                    do {
                                      puVar28[uVar19] = pbVar22[uVar19];
                                      uVar19 = uVar19 + 1;
                                    } while (uVar31 != uVar19);
                                  }
                                  puVar28[local_458] = 0xff;
                                  pbVar22 = pbVar22 + local_458;
                                  puVar28 = puVar28 + lVar18;
                                }
                                break;
                              case 1:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar10 = puVar10 + uVar15;
                                  do {
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        puVar28[uVar19] = puVar10[uVar19] + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    puVar28[local_458] = 0xff;
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + lVar18;
                                    puVar10 = puVar10 + lVar18;
                                    iVar13 = iVar13 + -1;
                                  } while (iVar13 != 0);
                                }
                                break;
                              case 2:
                                uVar6 = (z->s).img_x;
                                while (uVar6 = uVar6 - 1, uVar6 != 0) {
                                  if (0 < (int)uVar21) {
                                    uVar19 = 0;
                                    do {
                                      puVar28[uVar19] =
                                           puVar28[uVar19 + local_480] + pbVar22[uVar19];
                                      uVar19 = uVar19 + 1;
                                    } while (uVar31 != uVar19);
                                  }
                                  puVar28[local_458] = 0xff;
                                  pbVar22 = pbVar22 + local_458;
                                  puVar28 = puVar28 + lVar18;
                                }
                                break;
                              case 3:
                                uVar6 = (z->s).img_x;
                                while (uVar6 = uVar6 - 1, uVar6 != 0) {
                                  if (0 < (int)uVar21) {
                                    uVar19 = 0;
                                    do {
                                      puVar28[uVar19] =
                                           (char)((uint)puVar28[uVar19 - lVar18] +
                                                  (uint)puVar23[uVar19] >> 1) + pbVar22[uVar19];
                                      uVar19 = uVar19 + 1;
                                    } while (uVar19 != uVar31);
                                  }
                                  puVar28[local_458] = 0xff;
                                  pbVar22 = pbVar22 + local_458;
                                  puVar28 = puVar28 + lVar18;
                                  puVar23 = puVar23 + lVar18;
                                }
                                break;
                              case 4:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar10 = puVar10 + uVar15;
                                  lVar17 = (long)puVar10 + local_480;
                                  do {
                                    local_4a8 = iVar13;
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        bVar24 = puVar10[uVar19];
                                        bVar2 = puVar23[uVar19];
                                        bVar25 = *(byte *)(lVar17 + uVar19);
                                        iVar13 = ((uint)bVar24 + (uint)bVar2) - (uint)bVar25;
                                        uVar30 = iVar13 - (uint)bVar24;
                                        uVar27 = -uVar30;
                                        if (0 < (int)uVar30) {
                                          uVar27 = uVar30;
                                        }
                                        uVar29 = iVar13 - (uint)bVar2;
                                        uVar30 = -uVar29;
                                        if (0 < (int)uVar29) {
                                          uVar30 = uVar29;
                                        }
                                        uVar12 = iVar13 - (uint)bVar25;
                                        uVar29 = -uVar12;
                                        if (0 < (int)uVar12) {
                                          uVar29 = uVar12;
                                        }
                                        if (uVar30 <= uVar29) {
                                          bVar25 = bVar2;
                                        }
                                        if (uVar29 < uVar27) {
                                          bVar24 = bVar25;
                                        }
                                        if (uVar30 < uVar27) {
                                          bVar24 = bVar25;
                                        }
                                        puVar28[uVar19] = bVar24 + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    puVar28[local_458] = 0xff;
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + lVar18;
                                    puVar23 = puVar23 + lVar18;
                                    lVar17 = lVar17 + lVar18;
                                    puVar10 = puVar10 + lVar18;
                                    iVar13 = local_4a8 + -1;
                                  } while (local_4a8 + -1 != 0);
                                }
                                break;
                              case 5:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar10 = puVar10 + uVar15;
                                  do {
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        puVar28[uVar19] = (puVar10[uVar19] >> 1) + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    puVar28[local_458] = 0xff;
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + lVar18;
                                    puVar10 = puVar10 + lVar18;
                                    iVar13 = iVar13 + -1;
                                  } while (iVar13 != 0);
                                }
                                break;
                              case 6:
                                iVar13 = (z->s).img_x - 1;
                                if (iVar13 != 0) {
                                  puVar10 = puVar10 + uVar15;
                                  do {
                                    if (0 < (int)uVar21) {
                                      uVar19 = 0;
                                      do {
                                        puVar28[uVar19] = puVar10[uVar19] + pbVar22[uVar19];
                                        uVar19 = uVar19 + 1;
                                      } while (uVar31 != uVar19);
                                    }
                                    puVar28[local_458] = 0xff;
                                    pbVar22 = pbVar22 + local_458;
                                    puVar28 = puVar28 + lVar18;
                                    puVar10 = puVar10 + lVar18;
                                    iVar13 = iVar13 + -1;
                                  } while (iVar13 != 0);
                                }
                              }
                            }
                          }
                          else {
                            failure_reason = "Corrupt PNG";
                          }
                          if (4 < bVar20) goto LAB_001c3611;
                          uVar15 = (ulong)((int)uVar15 + local_4a4);
                          uVar19 = local_478 + 1;
                        } while (local_478 + 1 < (ulong)(z->s).img_y);
                      }
                      if ((char)local_470 != '\0') {
                        iVar13 = (z->s).img_out_n;
                        iVar8 = (z->s).img_y * (z->s).img_x;
                        puVar10 = z->out;
                        if (iVar13 == 2) {
                          if (iVar8 != 0) {
                            lVar18 = 0;
                            do {
                              puVar10[lVar18 * 2 + 1] = -(puVar10[lVar18 * 2] != local_4ab[0]);
                              lVar18 = lVar18 + 1;
                            } while (iVar8 != (int)lVar18);
                          }
                        }
                        else {
                          if (iVar13 != 4) {
                            __assert_fail("out_n == 2 || out_n == 4",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                                          ,0x86d,"int compute_transparency(png *, uint8 *, int)");
                          }
                          if (iVar8 != 0) {
                            lVar18 = 0;
                            do {
                              if (((puVar10[lVar18 * 4] == local_4ab[0]) &&
                                  (puVar10[lVar18 * 4 + 1] == local_4ab[1])) &&
                                 (puVar10[lVar18 * 4 + 2] == local_4ab[2])) {
                                puVar10[lVar18 * 4 + 3] = '\0';
                              }
                              lVar18 = lVar18 + 1;
                            } while (iVar8 != (int)lVar18);
                          }
                        }
                      }
                      if (bVar4 != 0) {
                        (z->s).img_n = (uint)bVar4;
                        uVar5 = (uint)bVar4;
                        if (2 < (int)local_484) {
                          uVar5 = local_484;
                        }
                        (z->s).img_out_n = uVar5;
                        uVar21 = (z->s).img_y * (z->s).img_x;
                        puVar10 = z->out;
                        puVar23 = (uint8 *)malloc((ulong)(uVar21 * uVar5));
                        if (puVar23 == (uint8 *)0x0) {
                          failure_reason = "Out of memory";
                        }
                        else {
                          if (uVar5 == 3) {
                            if (uVar21 != 0) {
                              uVar31 = 0;
                              puVar28 = puVar23;
                              do {
                                uVar19 = (ulong)puVar10[uVar31];
                                *puVar28 = auStack_438[uVar19 * 4];
                                puVar28[1] = auStack_438[uVar19 * 4 + 1];
                                puVar28[2] = auStack_438[uVar19 * 4 + 2];
                                puVar28 = puVar28 + 3;
                                uVar31 = uVar31 + 1;
                              } while (uVar21 != uVar31);
                            }
                          }
                          else if (uVar21 != 0) {
                            uVar31 = 0;
                            do {
                              uVar19 = (ulong)puVar10[uVar31];
                              puVar23[uVar31 * 4] = auStack_438[uVar19 * 4];
                              puVar23[uVar31 * 4 + 1] = auStack_438[uVar19 * 4 + 1];
                              puVar23[uVar31 * 4 + 2] = auStack_438[uVar19 * 4 + 2];
                              puVar23[uVar31 * 4 + 3] = auStack_438[uVar19 * 4 + 3];
                              uVar31 = uVar31 + 1;
                            } while (uVar21 != uVar31);
                          }
                          free(puVar10);
                          z->out = puVar23;
                        }
                        iVar13 = 0;
                        if (puVar23 == (uint8 *)0x0) goto LAB_001c3377;
                      }
                      free(z->expanded);
                      z->expanded = (uint8 *)0x0;
                      iVar13 = 1;
                    }
                    else {
                      failure_reason = "Corrupt PNG";
                    }
                  }
                }
              }
LAB_001c3377:
              bVar32 = false;
              goto LAB_001c32d0;
            }
LAB_001c3492:
            if ((uVar7 >> 0x1d & 1) != 0) {
              pFVar3 = (FILE *)(z->s).img_file;
              if (pFVar3 == (FILE *)0x0) {
                ppuVar1 = &(z->s).img_buffer;
                *ppuVar1 = *ppuVar1 + (int)uVar6;
              }
              else {
                fseek(pFVar3,(long)(int)uVar6,1);
              }
              goto LAB_001c36ef;
            }
            failure_reason = "PNG not supported: unknown chunk type";
          }
LAB_001c32cd:
          bVar32 = false;
          iVar13 = 0;
        }
        else {
          if (uVar7 == 0x74524e53) {
            if (z->idata != (uint8 *)0x0) goto LAB_001c32bd;
            if (bVar4 == 0) {
              uVar5 = (z->s).img_n;
              if (((uVar5 & 1) == 0) || (uVar7 = uVar5 * 2, uVar7 != uVar6)) {
                failure_reason = "Corrupt PNG";
                bVar4 = 0;
                goto LAB_001c32cd;
              }
              local_470 = CONCAT71((uint7)(uint3)(uVar7 >> 8),1);
              if ((z->s).img_n < 1) {
                bVar4 = 0;
              }
              else {
                lVar18 = 0;
                do {
                  get8(&z->s);
                  iVar8 = get8(&z->s);
                  local_4ab[lVar18] = (uint8)iVar8;
                  lVar18 = lVar18 + 1;
                } while (lVar18 < (z->s).img_n);
                bVar4 = 0;
              }
            }
            else {
              if (uVar5 == 0) goto LAB_001c3474;
              if (uVar5 < uVar6) goto LAB_001c32bd;
              bVar4 = 4;
              if (uVar31 != 0) {
                uVar19 = 0;
                do {
                  iVar8 = get8(&z->s);
                  auStack_438[(uVar19 & 0xffffffff) + 3] = (uint8)iVar8;
                  uVar19 = uVar19 + 4;
                } while (uVar31 << 2 != uVar19);
              }
            }
          }
          else {
            if (uVar7 == 0x504c5445) {
              if ((uVar6 < 0x301) && (local_490 = uVar31 / 3, (uVar6 / 3) * 3 == uVar6)) {
                if (2 < uVar6) {
                  uVar31 = 0;
                  do {
                    iVar8 = get8(&z->s);
                    auStack_438[uVar31 * 4] = (uint8)iVar8;
                    iVar8 = get8(&z->s);
                    auStack_438[uVar31 * 4 + 1] = (uint8)iVar8;
                    iVar8 = get8(&z->s);
                    auStack_438[uVar31 * 4 + 2] = (uint8)iVar8;
                    auStack_438[uVar31 * 4 + 3] = 0xff;
                    uVar31 = uVar31 + 1;
                  } while (uVar6 / 3 != uVar31);
                }
                goto LAB_001c36ef;
              }
LAB_001c32bd:
              failure_reason = "Corrupt PNG";
              goto LAB_001c32cd;
            }
            if (uVar7 != 0x49484452) goto LAB_001c3492;
            if (!(bool)(bVar20 & uVar6 == 0xd)) {
LAB_001c363b:
              pcVar14 = "Corrupt PNG";
              goto LAB_001c3642;
            }
            uVar6 = get32(&z->s);
            (z->s).img_x = uVar6;
            if (uVar6 < 0x1000001) {
              uVar6 = get32(&z->s);
              (z->s).img_y = uVar6;
              if (0x1000000 < uVar6) goto LAB_001c3346;
              iVar8 = get8(&z->s);
              if (iVar8 != 8) {
                pcVar14 = "PNG not supported: 8-bit only";
                goto LAB_001c3642;
              }
              uVar5 = get8(&z->s);
              if (6 < (int)uVar5) goto LAB_001c363b;
              bVar20 = 3;
              if ((uVar5 != 3) && (pcVar14 = "Corrupt PNG", bVar20 = bVar4, (uVar5 & 1) != 0))
              goto LAB_001c3642;
              iVar8 = get8(&z->s);
              bVar4 = bVar20;
              if ((iVar8 != 0) || (iVar8 = get8(&z->s), iVar8 != 0)) {
LAB_001c3dc1:
                pcVar14 = "Corrupt PNG";
                goto LAB_001c3642;
              }
              iVar8 = get8(&z->s);
              if (iVar8 != 0) {
                pcVar14 = "PNG not supported: interlaced mode";
                goto LAB_001c3642;
              }
              uVar21 = (z->s).img_x;
              if ((uVar21 == 0) || (uVar27 = (z->s).img_y, uVar27 == 0)) goto LAB_001c3dc1;
              if (bVar20 == 0) {
                uVar5 = (uVar5 >> 2 & 1) + (uVar5 & 2) + 1;
                (z->s).img_n = uVar5;
                bVar4 = 0;
                uVar5 = (uint)((0x40000000 / (ulong)uVar21) / (ulong)uVar5);
                pcVar14 = "Image too large to decode";
              }
              else {
                (z->s).img_n = 1;
                uVar5 = (uint)(0x40000000 / (ulong)uVar21) >> 2;
                pcVar14 = "Corrupt PNG";
              }
              bVar32 = true;
              if (uVar5 < uVar27) goto LAB_001c3642;
            }
            else {
LAB_001c3346:
              pcVar14 = "Very large image (corrupt?)";
LAB_001c3642:
              bVar32 = false;
              iVar13 = 0;
              failure_reason = pcVar14;
              bVar20 = bVar4;
            }
            bVar4 = bVar20;
            if (!bVar32) {
              bVar32 = false;
              goto LAB_001c32d0;
            }
          }
LAB_001c36ef:
          get32(&z->s);
          bVar32 = true;
        }
LAB_001c32d0:
        bVar20 = 0;
      } while (bVar32);
    }
  }
  return iVar13;
}

Assistant:

static int parse_png_file(png *z, int scan, int req_comp)
{
   uint8 palette[1024], pal_img_n=0;
   uint8 has_trans=0, tc[3];
   uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k;
   stbi *s = &z->s;

   if (!check_png_header(s)) return 0;

   if (scan == SCAN_type) return 1;

   for(;;first=0) {
      chunk c = get_chunk_header(s);
      if (first && c.type != PNG_TYPE('I','H','D','R'))
         return e("first not IHDR","Corrupt PNG");
      switch (c.type) {
         case PNG_TYPE('I','H','D','R'): {
            int depth,color,interlace,comp,filter;
            if (!first) return e("multiple IHDR","Corrupt PNG");
            if (c.length != 13) return e("bad IHDR len","Corrupt PNG");
            s->img_x = get32(s); if (s->img_x > (1 << 24)) return e("too large","Very large image (corrupt?)");
            s->img_y = get32(s); if (s->img_y > (1 << 24)) return e("too large","Very large image (corrupt?)");
            depth = get8(s);  if (depth != 8)        return e("8bit only","PNG not supported: 8-bit only");
            color = get8(s);  if (color > 6)         return e("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return e("bad ctype","Corrupt PNG");
            comp  = get8(s);  if (comp) return e("bad comp method","Corrupt PNG");
            filter= get8(s);  if (filter) return e("bad filter method","Corrupt PNG");
            interlace = get8(s); if (interlace) return e("interlaced","PNG not supported: interlaced mode");
            if (!s->img_x || !s->img_y) return e("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return e("too large", "Image too large to decode");
               if (scan == SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return e("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case PNG_TYPE('P','L','T','E'):  {
            if (c.length > 256*3) return e("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return e("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = get8u(s);
               palette[i*4+1] = get8u(s);
               palette[i*4+2] = get8u(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case PNG_TYPE('t','R','N','S'): {
            if (z->idata) return e("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return e("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return e("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = get8u(s);
            } else {
               if (!(s->img_n & 1)) return e("tRNS with alpha","Corrupt PNG");
               if (c.length != (uint32) s->img_n*2) return e("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (uint8) get16(s); // non 8-bit images will be larger
            }
            break;
         }

         case PNG_TYPE('I','D','A','T'): {
            if (pal_img_n && !pal_len) return e("no PLTE","Corrupt PNG");
            if (scan == SCAN_header) { s->img_n = pal_img_n; return 1; }
            if (ioff + c.length > idata_limit) {
               uint8 *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (uint8 *) realloc(z->idata, idata_limit); if (p == NULL) return e("outofmem", "Out of memory");
               z->idata = p;
            }
            #ifndef STBI_NO_STDIO
            if (s->img_file)
            {
               if (fread(z->idata+ioff,1,c.length,s->img_file) != c.length) return e("outofdata","Corrupt PNG");
            }
            else
            #endif
            {
               memcpy(z->idata+ioff, s->img_buffer, c.length);
               s->img_buffer += c.length;
            }
            ioff += c.length;
            break;
         }

         case PNG_TYPE('I','E','N','D'): {
            uint32 raw_len;
            if (scan != SCAN_load) return 1;
            if (z->idata == NULL) return e("no IDAT","Corrupt PNG");
            z->expanded = (uint8 *) stbi_zlib_decode_malloc((char *) z->idata, ioff, (int *) &raw_len);
            if (z->expanded == NULL) return 0; // zlib should set error
            free(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!create_png_image(z, z->expanded, raw_len, s->img_out_n)) return 0;
            if (has_trans)
               if (!compute_transparency(z, tc, s->img_out_n)) return 0;
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!expand_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            free(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX chunk not known";
               invalid_chunk[0] = (uint8) (c.type >> 24);
               invalid_chunk[1] = (uint8) (c.type >> 16);
               invalid_chunk[2] = (uint8) (c.type >>  8);
               invalid_chunk[3] = (uint8) (c.type >>  0);
               #endif
               return e(invalid_chunk, "PNG not supported: unknown chunk type");
            }
            skip(s, c.length);
            break;
      }
      // end of chunk, read and skip CRC
      get32(s);
   }
}